

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O2

bool cmFortranParser_FilePush(cmFortranParser *parser,char *fname)

{
  FILE *pFVar1;
  YY_BUFFER_STATE_conflict1 pyVar2;
  cmFortranFile f;
  string dir;
  allocator local_71;
  undefined1 local_70 [48];
  string local_40;
  
  std::__cxx11::string::string((string *)local_70,fname,(allocator *)&local_40);
  pFVar1 = cmsys::SystemTools::Fopen((string *)local_70,"rb");
  std::__cxx11::string::~string((string *)local_70);
  if (pFVar1 != (FILE *)0x0) {
    pyVar2 = cmFortranLexer_GetCurrentBuffer(parser->Scanner);
    std::__cxx11::string::string((string *)local_70,fname,&local_71);
    cmsys::SystemTools::GetParentDirectory(&local_40,(string *)local_70);
    std::__cxx11::string::~string((string *)local_70);
    local_70._0_8_ = pFVar1;
    local_70._8_8_ = pyVar2;
    std::__cxx11::string::string((string *)(local_70 + 0x10),(string *)&local_40);
    pyVar2 = cmFortran_yy_create_buffer((FILE *)0x0,0x4000,parser->Scanner);
    cmFortran_yy_switch_to_buffer(pyVar2,parser->Scanner);
    std::deque<cmFortranFile,_std::allocator<cmFortranFile>_>::push_back
              (&(parser->FileStack).c,(value_type *)local_70);
    std::__cxx11::string::~string((string *)(local_70 + 0x10));
    std::__cxx11::string::~string((string *)&local_40);
  }
  return pFVar1 != (FILE *)0x0;
}

Assistant:

bool cmFortranParser_FilePush(cmFortranParser* parser,
                                    const char* fname)
{
  // Open the new file and push it onto the stack.  Save the old
  // buffer with it on the stack.
  if(FILE* file = cmsys::SystemTools::Fopen(fname, "rb"))
    {
    YY_BUFFER_STATE current =
      cmFortranLexer_GetCurrentBuffer(parser->Scanner);
    std::string dir = cmSystemTools::GetParentDirectory(fname);
    cmFortranFile f(file, current, dir);
    YY_BUFFER_STATE buffer =
      cmFortran_yy_create_buffer(0, 16384, parser->Scanner);
    cmFortran_yy_switch_to_buffer(buffer, parser->Scanner);
    parser->FileStack.push(f);
    return 1;
    }
  else
    {
    return 0;
    }
}